

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  TestLog *pTVar1;
  float afVar2 [2];
  ostringstream *poVar3;
  ostream *poVar4;
  float fVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Vector<float,_2>_> *pVVar10;
  pointer pcVar11;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar12;
  byte bVar13;
  pointer pVVar14;
  pointer pMVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  _Rb_tree_node_base *p_Var19;
  IVal *pIVar20;
  IVal *pIVar21;
  long lVar22;
  long *plVar23;
  Vector<float,_2> *pVVar24;
  double dVar25;
  float afVar26 [2];
  float afVar27 [2];
  TestStatus *pTVar28;
  byte bVar29;
  IVal in2;
  FuncSet funcs;
  IVal reference1;
  IVal in3;
  Environment env;
  IVal reference0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  float in_stack_fffffffffffffab8;
  float fVar30;
  float fStack_544;
  size_type local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  undefined1 local_528 [8];
  undefined8 local_520;
  undefined1 auStack_518 [24];
  double dStack_500;
  pointer local_4f8;
  IVal local_4e9;
  TestLog *local_4e8;
  TestStatus *local_4e0;
  double local_4d8;
  ulong local_4d0;
  string local_4c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4a8;
  pointer local_478;
  long local_470;
  undefined1 local_468 [16];
  undefined8 local_458;
  Interval IStack_450;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  double local_428;
  Interval local_420;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  undefined1 local_1f8 [48];
  IVal local_1c8;
  ios_base local_188 [264];
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_4e0 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar17 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffffab8);
  local_4f8 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  dVar25 = (double)((long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_2e8,(size_t)dVar25);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4a8._M_impl.super__Rb_tree_header._M_header;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4a8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_4e8 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_468 + 8);
  local_468._0_8_ = local_4e8;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4d8 = dVar25;
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  local_520 = (double)((ulong)local_520._4_4_ << 0x20);
  auStack_518._0_4_ = 0.0;
  auStack_518._4_4_ = 0.0;
  dStack_500 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  auStack_518._8_8_ = (_Rb_tree_node_base *)&local_520;
  auStack_518._16_8_ = (_Rb_tree_node_base *)&local_520;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_528);
  if ((_Rb_tree_node_base *)auStack_518._8_8_ != (_Rb_tree_node_base *)&local_520) {
    p_Var19 = (_Rb_tree_node_base *)auStack_518._8_8_;
    do {
      (**(code **)(**(long **)(p_Var19 + 1) + 0x30))(*(long **)(p_Var19 + 1),local_1f8);
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
    } while (p_Var19 != (_Rb_tree_node_base *)&local_520);
  }
  dVar25 = local_4d8;
  if (dStack_500 != 0.0) {
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_4e8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)CONCAT44(fStack_544,in_stack_fffffffffffffab8),local_540);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_544,in_stack_fffffffffffffab8) != &local_538) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_544,in_stack_fffffffffffffab8),
                      local_538._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_528);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,(ulong)dVar25 & 0xffffffff,&local_218,&local_288,0);
  local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffffffffff00;
  local_1f8._8_8_ = INFINITY;
  local_1f8._16_8_ = (qpTestLog *)0xfff0000000000000;
  local_1f8._24_8_ = local_1f8._24_8_ & 0xffffffffffffff00;
  local_1f8._32_8_ = INFINITY;
  local_1f8._40_8_ = -INFINITY;
  local_528 = (undefined1  [8])((ulong)local_528 & 0xffffffffffffff00);
  local_520 = INFINITY;
  auStack_518._0_4_ = 0.0;
  auStack_518._4_4_ = -NAN;
  auStack_518._8_8_ = auStack_518._8_8_ & 0xffffffffffffff00;
  auStack_518._16_8_ = (_Base_ptr)0x7ff0000000000000;
  dStack_500 = -INFINITY;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_468);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_4a8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_1f8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_4a8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_528);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffab8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_4a8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_4e9);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == local_4f8) {
LAB_0091f79a:
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_4e8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ = (TestLog *)&local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    local_4e0->m_code = QP_TEST_RESULT_PASS;
    (local_4e0->m_description)._M_dataplus._M_p = (pointer)&(local_4e0->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0->m_description,local_468._0_8_,
               (long)(qpTestLog **)local_468._0_8_ + CONCAT44(local_468._12_4_,local_468._8_4_));
    pTVar28 = local_4e0;
    if ((TestLog *)local_468._0_8_ != (TestLog *)&local_458) {
      operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,(float)local_458) + 1);
      pTVar28 = local_4e0;
    }
    goto LAB_0091f984;
  }
  local_478 = (pointer)((long)dVar25 + (ulong)(dVar25 == 0.0));
  local_4f8 = (pointer)0x0;
  local_4d0 = 0;
  do {
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1f8);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
              ((IVal *)local_528,fmt,(Vector<float,_2> *)&stack0xfffffffffffffab8);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_468,fmt,(IVal *)local_528);
    pIVar20 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_4a8,
                         (this->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    pIVar20->m_data[1].m_lo = IStack_450.m_lo;
    pIVar20->m_data[1].m_hi = (double)CONCAT44(IStack_450.m_hi._4_4_,IStack_450.m_hi._0_4_);
    pIVar20->m_data[0].m_hi = (double)CONCAT44(local_458._4_4_,(float)local_458);
    *(ulong *)(pIVar20->m_data + 1) = CONCAT44(IStack_450._4_4_,IStack_450._0_4_);
    *(undefined8 *)pIVar20->m_data = local_468._0_8_;
    pIVar20->m_data[0].m_lo = (double)CONCAT44(local_468._12_4_,local_468._8_4_);
    fVar30 = local_278.in1.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start[(long)local_4f8].m_data[0];
    fVar5 = local_278.in1.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_4f8].m_data[1];
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
              ((IVal *)local_528,fmt,(Vector<float,_2> *)&stack0xfffffffffffffab8);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_468,fmt,(IVal *)local_528);
    pIVar20 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_4a8,
                         (this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    pIVar20->m_data[1].m_lo = IStack_450.m_lo;
    pIVar20->m_data[1].m_hi = (double)CONCAT44(IStack_450.m_hi._4_4_,IStack_450.m_hi._0_4_);
    pIVar20->m_data[0].m_hi = (double)CONCAT44(local_458._4_4_,(float)local_458);
    *(ulong *)(pIVar20->m_data + 1) = CONCAT44(IStack_450._4_4_,IStack_450._0_4_);
    *(undefined8 *)pIVar20->m_data = local_468._0_8_;
    pIVar20->m_data[0].m_lo = (double)CONCAT44(local_468._12_4_,local_468._8_4_);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_4a8,
               (this->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_4a8,
               (this->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    IStack_450.m_hi._0_4_ = (this->m_caseCtx).precision;
    IStack_450.m_lo = (this->m_caseCtx).floatFormat.m_maxValue;
    local_468._0_8_ = *(undefined8 *)fmt;
    local_468._8_4_ = (this->m_caseCtx).floatFormat.m_fractionBits;
    local_468._12_4_ = (this->m_caseCtx).floatFormat.m_hasSubnormal;
    local_458._0_4_ = (float)(this->m_caseCtx).floatFormat.m_hasInf;
    local_458._4_4_ = (float)(this->m_caseCtx).floatFormat.m_hasNaN;
    IStack_450.m_hasNaN = (this->m_caseCtx).floatFormat.m_exactPrecision;
    IStack_450._1_3_ = *(undefined3 *)&(this->m_caseCtx).floatFormat.field_0x19;
    IStack_450._4_4_ = *(undefined4 *)&(this->m_caseCtx).floatFormat.field_0x1c;
    uStack_430 = 0;
    pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_438 = &local_4a8;
    (*pSVar8->_vptr_Statement[3])(pSVar8,(MessageBuilder *)local_468);
    pIVar21 = Environment::lookup<tcu::Matrix<float,2,2>>
                        ((Environment *)&local_4a8,
                         (this->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_468,&local_2b8,pIVar21);
    pMVar15 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar14 = local_4f8;
    local_1f8._16_8_ = CONCAT44(local_458._4_4_,(float)local_458);
    local_1f8._8_8_ = CONCAT44(local_468._12_4_,local_468._8_4_);
    local_1f8._0_8_ = local_468._0_8_;
    local_1c8.m_data[0].m_hi = local_428;
    local_1c8.m_data[0].m_lo = (double)CONCAT44(uStack_42c,uStack_430);
    local_1c8.m_data[0]._0_8_ = local_438;
    local_1f8._40_8_ = CONCAT44(IStack_450.m_hi._4_4_,IStack_450.m_hi._0_4_);
    local_1f8._24_8_ = CONCAT44(IStack_450._4_4_,IStack_450._0_4_);
    local_1f8._32_8_ = IStack_450.m_lo;
    local_1c8.m_data[1].m_hi = local_420.m_hi;
    local_1c8.m_data[1].m_hasNaN = local_420.m_hasNaN;
    local_1c8.m_data[1]._1_7_ = local_420._1_7_;
    local_1c8.m_data[1].m_lo = local_420.m_lo;
    local_470 = (long)local_4f8 * 0x10;
    bVar29 = 1;
    pIVar20 = (IVal *)local_1f8;
    lVar22 = 0;
    do {
      bVar16 = contains<tcu::Vector<float,2>>(pIVar20,pMVar15[(long)pVVar14].m_data.m_data + lVar22)
      ;
      lVar22 = 1;
      pIVar20 = &local_1c8;
      bVar13 = bVar29 & bVar16;
      bVar29 = 0;
    } while (bVar13 != 0);
    local_468._0_8_ = &local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468,"Shader output 0 is outside acceptable range","");
    bVar16 = tcu::ResultCollector::check(&local_80,bVar16,(string *)local_468);
    if ((TestLog *)local_468._0_8_ != (TestLog *)&local_458) {
      operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,(float)local_458) + 1);
    }
    if ((!bVar16) && (uVar18 = (int)local_4d0 + 1, local_4d0 = (ulong)uVar18, (int)uVar18 < 0x65)) {
      local_468._0_8_ = local_4e8;
      poVar3 = (ostringstream *)(local_468 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
      pVVar10 = (this->m_variables).in0.
                super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr;
      pVVar24 = (Vector<float,_2> *)auStack_518;
      pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
      local_528 = (undefined1  [8])pVVar24;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_528,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_468 + 8),(char *)local_528,(long)local_520);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
      pVVar14 = local_4f8;
      valueToString<tcu::Vector<float,2>>
                ((string *)&stack0xfffffffffffffab8,(shaderexecutor *)&local_2b8,
                 (FloatFormat *)
                 (local_278.in0.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_4f8),pVVar24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_468 + 8),(char *)CONCAT44(fVar5,fVar30),local_540);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fVar5,fVar30) != &local_538) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fVar5,fVar30),local_538._M_allocated_capacity + 1);
      }
      if (local_528 != (undefined1  [8])auStack_518) {
        operator_delete((void *)local_528,(ulong)(auStack_518._0_8_ + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
      pVVar10 = (this->m_variables).in1.
                super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr;
      pVVar24 = (Vector<float,_2> *)auStack_518;
      pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
      local_528 = (undefined1  [8])pVVar24;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_528,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_468 + 8),(char *)local_528,(long)local_520);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
      valueToString<tcu::Vector<float,2>>
                ((string *)&stack0xfffffffffffffab8,(shaderexecutor *)&local_2b8,
                 (FloatFormat *)
                 (local_278.in1.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pVVar14),pVVar24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_468 + 8),(char *)CONCAT44(fVar5,fVar30),local_540);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fVar5,fVar30) != &local_538) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fVar5,fVar30),local_538._M_allocated_capacity + 1);
      }
      if (local_528 != (undefined1  [8])auStack_518) {
        operator_delete((void *)local_528,(ulong)(auStack_518._0_8_ + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
      pVVar12 = (this->m_variables).out0.
                super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.
                m_ptr;
      pIVar21 = (IVal *)auStack_518;
      pcVar11 = (pVVar12->m_name)._M_dataplus._M_p;
      local_528 = (undefined1  [8])pIVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_528,pcVar11,pcVar11 + (pVVar12->m_name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_468 + 8),(char *)local_528,(long)local_520);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
      valueToString<tcu::Matrix<float,2,2>>
                ((string *)&stack0xfffffffffffffab8,(shaderexecutor *)&local_2b8,
                 (FloatFormat *)
                 ((long)((local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                 local_470),(Matrix<float,_2,_2> *)pIVar21);
      poVar4 = (ostream *)(local_468 + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(char *)CONCAT44(fVar5,fVar30),local_540);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
      intervalToString<tcu::Matrix<float,2,2>>
                (&local_4c8,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1f8,pIVar21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_468 + 8),local_4c8._M_dataplus._M_p,local_4c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fVar5,fVar30) != &local_538) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fVar5,fVar30),local_538._M_allocated_capacity + 1);
      }
      if (local_528 != (undefined1  [8])auStack_518) {
        operator_delete((void *)local_528,(ulong)(auStack_518._0_8_ + 1));
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
      std::ios_base::~ios_base(local_3f0);
    }
    local_4f8 = (pointer)((long)local_4f8->m_data + 1);
  } while (local_4f8 != local_478);
  iVar17 = (int)local_4d0;
  if (iVar17 < 0x65) {
    if (iVar17 == 0) goto LAB_0091f79a;
  }
  else {
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_4e8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar17 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
  }
  poVar3 = (ostringstream *)(local_468 + 8);
  local_468._0_8_ = local_4e8;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::ostream::operator<<(poVar3,iVar17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
  std::ostream::operator<<(local_468,iVar17);
  pTVar28 = local_4e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
  std::ios_base::~ios_base(local_3f8);
  local_468._0_8_ = &local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468," test failed. Check log for the details","");
  afVar2 = (float  [2])(CONCAT44(local_468._12_4_,local_468._8_4_) + (long)local_520);
  afVar26[0] = 2.10195e-44;
  afVar26[1] = 0.0;
  if (local_528 != (undefined1  [8])auStack_518) {
    afVar26 = (float  [2])auStack_518._0_8_;
  }
  if ((ulong)afVar26 < (ulong)afVar2) {
    afVar27[0] = 2.10195e-44;
    afVar27[1] = 0.0;
    if ((TestLog *)local_468._0_8_ != (TestLog *)&local_458) {
      afVar27[1] = local_458._4_4_;
      afVar27[0] = (float)local_458;
    }
    if ((ulong)afVar27 < (ulong)afVar2) goto LAB_0091f78b;
    plVar23 = (long *)std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,(ulong)local_528)
    ;
  }
  else {
LAB_0091f78b:
    plVar23 = (long *)std::__cxx11::string::_M_append(local_528,local_468._0_8_);
  }
  local_1f8._0_8_ = local_1f8 + 0x10;
  pTVar1 = (TestLog *)(plVar23 + 2);
  if ((TestLog *)*plVar23 == pTVar1) {
    local_1f8._16_8_ = pTVar1->m_log;
    local_1f8._24_8_ = plVar23[3];
  }
  else {
    local_1f8._16_8_ = pTVar1->m_log;
    local_1f8._0_8_ = (TestLog *)*plVar23;
  }
  local_1f8._8_8_ = plVar23[1];
  *plVar23 = (long)pTVar1;
  plVar23[1] = 0;
  *(undefined1 *)&pTVar1->m_log = 0;
  pTVar28->m_code = QP_TEST_RESULT_FAIL;
  (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar28->m_description,local_1f8._0_8_,
             (undefined1 *)((long)(qpTestLog **)local_1f8._0_8_ + local_1f8._8_8_));
  if ((TestLog *)local_1f8._0_8_ != (TestLog *)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,(ulong)((long)(deUint32 *)local_1f8._16_8_ + 1));
  }
  if ((TestLog *)local_468._0_8_ != (TestLog *)&local_458) {
    operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,(float)local_458) + 1);
  }
  if (local_528 != (undefined1  [8])auStack_518) {
    operator_delete((void *)local_528,(ulong)(auStack_518._0_8_ + 1));
  }
LAB_0091f984:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4a8);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}